

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O3

spv_result_t
spvTextToBinaryWithOptions
          (spv_const_context context,char *input_text,size_t input_text_size,uint32_t options,
          spv_binary *pBinary,spv_diagnostic *pDiagnostic)

{
  MessageConsumer *consumer;
  _Manager_type p_Var1;
  pointer __src;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined4 env;
  undefined8 uVar4;
  bool bVar5;
  spv_result_t sVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  spv_instruction_t *inst_1;
  pointer psVar9;
  uint32_t *puVar10;
  spv_binary psVar11;
  size_t __n;
  iterator __end1;
  iterator __begin1;
  pointer psVar12;
  char cVar13;
  long lVar14;
  size_t sVar15;
  spv_text_t text;
  vector<spv_instruction_t,_std::allocator<spv_instruction_t>_> instructions;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> ids_to_preserve;
  AssemblyContext context_1;
  spv_instruction_t inst;
  undefined1 local_428 [24];
  spv_ext_inst_table local_410;
  spv_text_t local_408;
  undefined1 local_3f8 [16];
  pointer local_3e8;
  spv_context_t local_3d8;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_390;
  AssemblyContext local_360;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  _Base_ptr local_1e8;
  size_t local_1e0;
  spv_result_t local_38;
  
  local_3d8.target_env = context->target_env;
  local_3d8._4_4_ = *(undefined4 *)&context->field_0x4;
  local_3d8.opcode_table = context->opcode_table;
  local_3d8.operand_table._0_4_ = *(undefined4 *)&context->operand_table;
  local_3d8.operand_table._4_4_ = *(undefined4 *)((long)&context->operand_table + 4);
  local_3d8.ext_inst_table._0_4_ = *(undefined4 *)&context->ext_inst_table;
  local_3d8.ext_inst_table._4_4_ = *(undefined4 *)((long)&context->ext_inst_table + 4);
  consumer = &local_3d8.consumer;
  local_3d8.consumer.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_3d8.consumer.super__Function_base._M_functor._8_8_ = 0;
  local_3d8.consumer.super__Function_base._M_manager = (_Manager_type)0x0;
  local_3d8.consumer._M_invoker = (_Invoker_type)0x0;
  p_Var1 = (context->consumer).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)consumer,(_Any_data *)&context->consumer,__clone_functor);
    local_3d8.consumer.super__Function_base._M_manager =
         (context->consumer).super__Function_base._M_manager;
    local_3d8.consumer._M_invoker = (context->consumer)._M_invoker;
  }
  if (pDiagnostic != (spv_diagnostic *)0x0) {
    *pDiagnostic = (spv_diagnostic)0x0;
    spvtools::UseDiagnosticAsMessageConsumer(&local_3d8,pDiagnostic);
  }
  local_428._0_4_ = local_3d8.target_env;
  auVar2._8_4_ = local_3d8.operand_table._0_4_;
  auVar2._0_8_ = local_3d8.opcode_table;
  auVar2._12_4_ = local_3d8.operand_table._4_4_;
  local_428._8_8_ = auVar2._8_8_;
  local_428._16_4_ = (int)local_3d8.opcode_table;
  local_428._20_4_ = (int)((ulong)local_3d8.opcode_table >> 0x20);
  local_410 = (spv_ext_inst_table)
              CONCAT44(local_3d8.ext_inst_table._4_4_,local_3d8.ext_inst_table._0_4_);
  local_390._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_390._M_impl.super__Rb_tree_header._M_header;
  local_390._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_390._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_390._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_408.str = input_text;
  local_408.length = input_text_size;
  local_390._M_impl.super__Rb_tree_header._M_header._M_right =
       local_390._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((options & 2) != 0) {
    local_1e8 = (_Base_ptr)(local_208 + 8);
    local_208 = (undefined1  [16])0x0;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_1e8;
    local_1f8 = auVar3 << 0x40;
    local_1e0 = 0;
    spvtools::AssemblyContext::AssemblyContext
              (&local_360,&local_408,consumer,
               (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
               local_208);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                *)local_208,(_Link_type)local_1f8._0_8_);
    if (local_408.str == (char *)0x0) {
      spvtools::AssemblyContext::diagnostic
                ((DiagnosticStream *)local_208,&local_360,SPV_ERROR_INVALID_TEXT);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"Missing assembly text.",0x16);
      sVar6 = local_38;
      spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
    }
    else {
      bVar5 = spvtools::AssemblyGrammar::isValid((AssemblyGrammar *)local_428);
      sVar6 = SPV_ERROR_INVALID_TABLE;
      if (bVar5) {
        spvtools::AssemblyContext::advance(&local_360);
        do {
          bVar5 = spvtools::AssemblyContext::hasText(&local_360);
          if (!bVar5) goto LAB_00623f55;
          local_1f8 = (undefined1  [16])0x0;
          local_1e8 = (_Base_ptr)0x0;
          local_208._0_4_ = 0x7fffffff;
          sVar6 = anon_unknown.dwarf_2aef2bd::spvTextEncodeOpcode
                            ((AssemblyGrammar *)local_428,&local_360,(spv_instruction_t *)local_208)
          ;
          cVar13 = '\x01';
          if (sVar6 == SPV_SUCCESS) {
            sVar6 = spvtools::AssemblyContext::advance(&local_360);
            cVar13 = (sVar6 != SPV_SUCCESS) * '\x03';
          }
          if ((_Base_ptr)local_1f8._0_8_ != (_Base_ptr)0x0) {
            operator_delete((void *)local_1f8._0_8_,(long)local_1e8 - local_1f8._0_8_);
          }
        } while (cVar13 == '\0');
        if (cVar13 == '\x03') {
LAB_00623f55:
          spvtools::AssemblyContext::GetNumericIds
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     local_208,&local_360);
          std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::operator=
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     &local_390,
                     (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     local_208);
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)local_208,(_Link_type)local_1f8._0_8_);
          sVar6 = SPV_SUCCESS;
        }
        else {
          sVar6 = SPV_ERROR_INVALID_TEXT;
        }
      }
    }
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::_M_erase(&local_360.ids_to_preserve_._M_t,
               (_Link_type)
               local_360.ids_to_preserve_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    if (local_360.consumer_.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_360.consumer_.super__Function_base._M_manager)
                ((_Any_data *)&local_360.consumer_,(_Any_data *)&local_360.consumer_,
                 __destroy_functor);
    }
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_std::allocator<std::pair<const_unsigned_int,_spv_ext_inst_type_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_360.import_id_to_ext_inst_type_._M_h);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_360.value_types_._M_h);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::IdType>,_std::allocator<std::pair<const_unsigned_int,_spvtools::IdType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_360.types_._M_h);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&local_360);
    if (sVar6 != SPV_SUCCESS) goto LAB_0062430f;
  }
  spvtools::AssemblyContext::AssemblyContext
            (&local_360,&local_408,consumer,
             (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&local_390
            );
  if (local_408.str == (char *)0x0) {
    spvtools::AssemblyContext::diagnostic
              ((DiagnosticStream *)local_208,&local_360,SPV_ERROR_INVALID_TEXT);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,"Missing assembly text.",0x16);
    spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
    sVar6 = local_38;
  }
  else {
    bVar5 = spvtools::AssemblyGrammar::isValid((AssemblyGrammar *)local_428);
    sVar6 = SPV_ERROR_INVALID_TABLE;
    if (bVar5) {
      if (pBinary == (spv_binary *)0x0) {
        sVar6 = SPV_ERROR_INVALID_POINTER;
      }
      else {
        local_3f8 = (undefined1  [16])0x0;
        local_3e8 = (pointer)0x0;
        spvtools::AssemblyContext::advance(&local_360);
        do {
          bVar5 = spvtools::AssemblyContext::hasText(&local_360);
          if (!bVar5) break;
          local_208._0_12_ = ZEXT812(0);
          local_1e8 = (_Base_ptr)0x0;
          local_1f8 = (undefined1  [16])0x0;
          std::vector<spv_instruction_t,_std::allocator<spv_instruction_t>_>::
          emplace_back<spv_instruction_t>
                    ((vector<spv_instruction_t,_std::allocator<spv_instruction_t>_> *)local_3f8,
                     (spv_instruction_t *)local_208);
          if ((_Base_ptr)local_1f8._0_8_ != (_Base_ptr)0x0) {
            operator_delete((void *)local_1f8._0_8_,(long)local_1e8 - local_1f8._0_8_);
          }
          sVar6 = anon_unknown.dwarf_2aef2bd::spvTextEncodeOpcode
                            ((AssemblyGrammar *)local_428,&local_360,
                             (spv_instruction_t *)(local_3f8._8_8_ + -0x28));
          if (sVar6 != SPV_SUCCESS) goto LAB_00624296;
          sVar6 = spvtools::AssemblyContext::advance(&local_360);
        } while (sVar6 == SPV_SUCCESS);
        psVar12 = (pointer)local_3f8._0_8_;
        uVar4 = local_3f8._8_8_;
        if (local_3f8._0_8_ == local_3f8._8_8_) {
          puVar10 = (uint32_t *)operator_new__(0x14);
          sVar15 = 5;
        }
        else {
          sVar15 = 5;
          psVar9 = (pointer)local_3f8._0_8_;
          do {
            sVar15 = sVar15 + ((long)(psVar9->words).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(psVar9->words).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 2);
            psVar9 = psVar9 + 1;
          } while (psVar9 != (pointer)local_3f8._8_8_);
          puVar10 = (uint32_t *)operator_new__(-(ulong)(sVar15 >> 0x3e != 0) | sVar15 * 4);
          lVar14 = 5;
          do {
            __src = (psVar12->words).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_start;
            __n = (long)(psVar12->words).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)__src;
            memcpy(puVar10 + lVar14,__src,__n);
            lVar14 = lVar14 + ((long)__n >> 2);
            psVar12 = psVar12 + 1;
          } while (psVar12 != (pointer)uVar4);
        }
        env = local_428._0_4_;
        uVar7 = spvtools::AssemblyContext::getBound(&local_360);
        *puVar10 = 0x7230203;
        uVar8 = spvVersionForTargetEnv(env);
        puVar10[1] = uVar8;
        puVar10[2] = 0x70000;
        puVar10[3] = uVar7;
        puVar10[4] = 0;
        psVar11 = (spv_binary)operator_new(0x10);
        psVar11->code = puVar10;
        psVar11->wordCount = sVar15;
        *pBinary = psVar11;
        sVar6 = SPV_SUCCESS;
LAB_00624296:
        std::vector<spv_instruction_t,_std::allocator<spv_instruction_t>_>::~vector
                  ((vector<spv_instruction_t,_std::allocator<spv_instruction_t>_> *)local_3f8);
      }
    }
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::_M_erase(&local_360.ids_to_preserve_._M_t,
             (_Link_type)
             local_360.ids_to_preserve_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  if (local_360.consumer_.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_360.consumer_.super__Function_base._M_manager)
              ((_Any_data *)&local_360.consumer_,(_Any_data *)&local_360.consumer_,__destroy_functor
              );
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_std::allocator<std::pair<const_unsigned_int,_spv_ext_inst_type_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_360.import_id_to_ext_inst_type_._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_360.value_types_._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::IdType>,_std::allocator<std::pair<const_unsigned_int,_spvtools::IdType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_360.types_._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_360);
LAB_0062430f:
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::_M_erase(&local_390,(_Link_type)local_390._M_impl.super__Rb_tree_header._M_header._M_parent);
  if ((pDiagnostic != (spv_diagnostic *)0x0) && (*pDiagnostic != (spv_diagnostic)0x0)) {
    (*pDiagnostic)->isTextSource = true;
  }
  if (local_3d8.consumer.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3d8.consumer.super__Function_base._M_manager)
              ((_Any_data *)&local_3d8.consumer,(_Any_data *)&local_3d8.consumer,__destroy_functor);
  }
  return sVar6;
}

Assistant:

spv_result_t spvTextToBinaryWithOptions(const spv_const_context context,
                                        const char* input_text,
                                        const size_t input_text_size,
                                        const uint32_t options,
                                        spv_binary* pBinary,
                                        spv_diagnostic* pDiagnostic) {
  spv_context_t hijack_context = *context;
  if (pDiagnostic) {
    *pDiagnostic = nullptr;
    spvtools::UseDiagnosticAsMessageConsumer(&hijack_context, pDiagnostic);
  }

  spv_text_t text = {input_text, input_text_size};
  spvtools::AssemblyGrammar grammar(&hijack_context);

  spv_result_t result = spvTextToBinaryInternal(
      grammar, hijack_context.consumer, &text, options, pBinary);
  if (pDiagnostic && *pDiagnostic) (*pDiagnostic)->isTextSource = true;

  return result;
}